

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O3

void __thiscall
ProcessorGenerator::generate_dispatch_call(ProcessorGenerator *this,bool template_protocol)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  t_cpp_generator *ptVar3;
  int iVar4;
  ostream *poVar5;
  undefined7 in_register_00000031;
  char *pcVar6;
  string protocol;
  string function_suffix;
  string local_1b0;
  char *local_190;
  char *local_188;
  char local_180 [16];
  string local_170;
  string local_150;
  char *local_130;
  char *local_128;
  char local_120 [16];
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_190 = local_180;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_190,"::apache::thrift::protocol::TProtocol","");
  local_130 = local_120;
  local_128 = (char *)0x0;
  local_120[0] = '\0';
  if ((int)CONCAT71(in_register_00000031,template_protocol) != 0) {
    std::__cxx11::string::_M_replace((ulong)&local_190,0,local_188,0x38078a);
    std::__cxx11::string::_M_replace((ulong)&local_130,0,local_128,0x381d1e);
  }
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (this->f_out_,(this->template_header_)._M_dataplus._M_p,
                      (this->template_header_)._M_string_length);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(this->ret_type_)._M_dataplus._M_p,(this->ret_type_)._M_string_length);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(this->class_name_)._M_dataplus._M_p,
                      (this->class_name_)._M_string_length);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(this->template_suffix_)._M_dataplus._M_p,
                      (this->template_suffix_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"::dispatchCall",0xe);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_130,(long)local_128);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(",1);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(this->finish_cob_)._M_dataplus._M_p,
                      (this->finish_cob_)._M_string_length);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_190,(long)local_188);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"* iprot, ",9);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_190,(long)local_188);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"* oprot, ",9);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"const std::string& fname, int32_t seqid",0x27);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(this->call_context_)._M_dataplus._M_p,
                      (this->call_context_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,") {",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  ptVar3 = this->generator_;
  piVar1 = &(ptVar3->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar5 = this->f_out_;
  t_generator::indent_abi_cxx11_(&local_1b0,(t_generator *)ptVar3);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_1b0._M_dataplus._M_p,local_1b0._M_string_length);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(this->typename_str_)._M_dataplus._M_p,
                      (this->typename_str_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"ProcessMap::iterator pfn;",0x19);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_150,(t_generator *)this->generator_);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_150._M_dataplus._M_p,local_150._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"pfn = processMap_.find(fname);",0x1e);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_170,(t_generator *)this->generator_);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_170._M_dataplus._M_p,local_170._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"if (pfn == processMap_.end()) {",0x1f);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  paVar2 = &local_1b0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  poVar5 = this->f_out_;
  if ((this->extends_)._M_string_length == 0) {
    t_generator::indent_abi_cxx11_(&local_1b0,(t_generator *)this->generator_);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_1b0._M_dataplus._M_p,local_1b0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"  iprot->skip(::apache::thrift::protocol::T_STRUCT);",0x34);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_150,(t_generator *)this->generator_);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_150._M_dataplus._M_p,local_150._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  iprot->readMessageEnd();",0x1a);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_170,(t_generator *)this->generator_);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_170._M_dataplus._M_p,local_170._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"  iprot->getTransport()->readEnd();",0x23);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_50,(t_generator *)this->generator_);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,
               "  ::apache::thrift::TApplicationException x(::apache::thrift::TApplicationException::UNKNOWN_METHOD, \"Invalid method name: \'\"+fname+\"\'\");"
               ,0x89);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_70,(t_generator *)this->generator_);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_70._M_dataplus._M_p,local_70._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,
               "  oprot->writeMessageBegin(fname, ::apache::thrift::protocol::T_EXCEPTION, seqid);",
               0x52);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this->generator_);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_90._M_dataplus._M_p,local_90._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  x.write(oprot);",0x11);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this->generator_);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_b0._M_dataplus._M_p,local_b0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  oprot->writeMessageEnd();",0x1b);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this->generator_);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_d0._M_dataplus._M_p,local_d0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"  oprot->getTransport()->writeEnd();",0x24);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_f0,(t_generator *)this->generator_);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_f0._M_dataplus._M_p,local_f0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"  oprot->getTransport()->flush();",0x21);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_110,(t_generator *)this->generator_);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_110._M_dataplus._M_p,local_110._M_string_length);
    iVar4 = std::__cxx11::string::compare((char *)&this->style_);
    pcVar6 = "  return true;";
    if (iVar4 == 0) {
      pcVar6 = "  return cob(true);";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,(ulong)(iVar4 == 0) * 5 + 0xe);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p);
    }
  }
  else {
    t_generator::indent_abi_cxx11_(&local_1b0,(t_generator *)this->generator_);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_1b0._M_dataplus._M_p,local_1b0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  return ",9);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(this->extends_)._M_dataplus._M_p,(this->extends_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"::dispatchCall(",0xf);
    iVar4 = std::__cxx11::string::compare((char *)&this->style_);
    pcVar6 = "";
    if (iVar4 == 0) {
      pcVar6 = "cob, ";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,(ulong)(iVar4 == 0) * 5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"iprot, oprot, fname, seqid",0x1a);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(this->call_context_arg_)._M_dataplus._M_p,
                        (this->call_context_arg_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,");",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  poVar5 = this->f_out_;
  t_generator::indent_abi_cxx11_(&local_1b0,(t_generator *)this->generator_);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_1b0._M_dataplus._M_p,local_1b0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  if (template_protocol) {
    poVar5 = this->f_out_;
    t_generator::indent_abi_cxx11_(&local_1b0,(t_generator *)this->generator_);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_1b0._M_dataplus._M_p,local_1b0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"(this->*(pfn->second.specialized))",0x22);
  }
  else {
    ptVar3 = this->generator_;
    if (ptVar3->gen_templates_only_ == true) {
      poVar5 = this->f_out_;
      t_generator::indent_abi_cxx11_(&local_1b0,(t_generator *)ptVar3);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_1b0._M_dataplus._M_p,local_1b0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"(this->*(pfn->second.generic))",0x1e);
    }
    else {
      poVar5 = this->f_out_;
      if (ptVar3->gen_templates_ == true) {
        t_generator::indent_abi_cxx11_(&local_1b0,(t_generator *)ptVar3);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_1b0._M_dataplus._M_p,local_1b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"(this->*(pfn->second.generic))",0x1e);
      }
      else {
        t_generator::indent_abi_cxx11_(&local_1b0,(t_generator *)ptVar3);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_1b0._M_dataplus._M_p,local_1b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(this->*(pfn->second))",0x16);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  poVar5 = this->f_out_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(",1);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(this->cob_arg_)._M_dataplus._M_p,(this->cob_arg_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"seqid, iprot, oprot",0x13);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(this->call_context_arg_)._M_dataplus._M_p,
                      (this->call_context_arg_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,");",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  iVar4 = std::__cxx11::string::compare((char *)&this->style_);
  poVar5 = this->f_out_;
  if (iVar4 == 0) {
    t_generator::indent_abi_cxx11_(&local_1b0,(t_generator *)this->generator_);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_1b0._M_dataplus._M_p,local_1b0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"return;",7);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  else {
    t_generator::indent_abi_cxx11_(&local_1b0,(t_generator *)this->generator_);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_1b0._M_dataplus._M_p,local_1b0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"return true;",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  piVar1 = &(this->generator_->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar5 = this->f_out_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_130 != local_120) {
    operator_delete(local_130);
  }
  if (local_190 != local_180) {
    operator_delete(local_190);
  }
  return;
}

Assistant:

void ProcessorGenerator::generate_dispatch_call(bool template_protocol) {
  string protocol = "::apache::thrift::protocol::TProtocol";
  string function_suffix;
  if (template_protocol) {
    protocol = "Protocol_";
    // We call the generic version dispatchCall(), and the specialized
    // version dispatchCallTemplated().  We can't call them both
    // dispatchCall(), since this will cause the compiler to issue a warning if
    // a service that doesn't use templates inherits from a service that does
    // use templates: the compiler complains that the subclass only implements
    // the generic version of dispatchCall(), and hides the templated version.
    // Using different names for the two functions prevents this.
    function_suffix = "Templated";
  }

  f_out_ << template_header_ << ret_type_ << class_name_ << template_suffix_ << "::dispatchCall"
         << function_suffix << "(" << finish_cob_ << protocol << "* iprot, " << protocol
         << "* oprot, "
         << "const std::string& fname, int32_t seqid" << call_context_ << ") {" << endl;
  indent_up();

  // HOT: member function pointer map
  f_out_ << indent() << typename_str_ << "ProcessMap::iterator pfn;" << endl << indent()
         << "pfn = processMap_.find(fname);" << endl << indent()
         << "if (pfn == processMap_.end()) {" << endl;
  if (extends_.empty()) {
    f_out_ << indent() << "  iprot->skip(::apache::thrift::protocol::T_STRUCT);" << endl << indent()
           << "  iprot->readMessageEnd();" << endl << indent()
           << "  iprot->getTransport()->readEnd();" << endl << indent()
           << "  ::apache::thrift::TApplicationException "
              "x(::apache::thrift::TApplicationException::UNKNOWN_METHOD, \"Invalid method name: "
              "'\"+fname+\"'\");" << endl << indent()
           << "  oprot->writeMessageBegin(fname, ::apache::thrift::protocol::T_EXCEPTION, seqid);"
           << endl << indent() << "  x.write(oprot);" << endl << indent()
           << "  oprot->writeMessageEnd();" << endl << indent()
           << "  oprot->getTransport()->writeEnd();" << endl << indent()
           << "  oprot->getTransport()->flush();" << endl << indent()
           << (style_ == "Cob" ? "  return cob(true);" : "  return true;") << endl;
  } else {
    f_out_ << indent() << "  return " << extends_ << "::dispatchCall("
           << (style_ == "Cob" ? "cob, " : "") << "iprot, oprot, fname, seqid" << call_context_arg_
           << ");" << endl;
  }
  f_out_ << indent() << "}" << endl;
  if (template_protocol) {
    f_out_ << indent() << "(this->*(pfn->second.specialized))";
  } else {
    if (generator_->gen_templates_only_) {
      // TODO: This is a null pointer, so nothing good will come from calling
      // it.  Throw an exception instead.
      f_out_ << indent() << "(this->*(pfn->second.generic))";
    } else if (generator_->gen_templates_) {
      f_out_ << indent() << "(this->*(pfn->second.generic))";
    } else {
      f_out_ << indent() << "(this->*(pfn->second))";
    }
  }
  f_out_ << "(" << cob_arg_ << "seqid, iprot, oprot" << call_context_arg_ << ");" << endl;

  // TODO(dreiss): return pfn ret?
  if (style_ == "Cob") {
    f_out_ << indent() << "return;" << endl;
  } else {
    f_out_ << indent() << "return true;" << endl;
  }

  indent_down();
  f_out_ << "}" << endl << endl;
}